

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::initialize(InputFile *this)

{
  bool bVar1;
  __type _Var2;
  int *piVar3;
  _Rb_tree_color *p_Var4;
  void *pvVar5;
  ostream *poVar6;
  string *psVar7;
  ArgExc *pAVar8;
  DeepScanLineInputFile *this_00;
  ScanLineInputFile *in_RDI;
  stringstream _iex_throw_s_1;
  Box2i *dataWindow_3;
  Box2i *dataWindow_2;
  stringstream _iex_throw_s;
  Box2i *dataWindow_1;
  Box2i *dataWindow;
  DeepScanLineInputFile *in_stack_fffffffffffffc48;
  CompositeDeepScanLine *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  InputPartData *in_stack_fffffffffffffc68;
  InputPartData *in_stack_fffffffffffffc78;
  IStream *in_stack_fffffffffffffc80;
  InputPartData *in_stack_fffffffffffffc88;
  ScanLineInputFile *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  int numThreads;
  IStream *in_stack_fffffffffffffca0;
  Header *in_stack_fffffffffffffca8;
  stringstream local_348 [16];
  ostream local_338 [376];
  Box2i *local_1c0;
  Box2i *local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  Box2i *local_28;
  Box2i *local_10;
  
  numThreads = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  if (*(long *)&(((Data *)in_RDI->_data)->tileOffsets)._numYLevels == 0) {
    bVar1 = Header::hasType((Header *)0x867260);
    if (bVar1) {
      Header::type_abi_cxx11_((Header *)0x86727b);
      _Var2 = std::operator==(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      if (_Var2) {
        *(undefined1 *)&(((Data *)in_RDI->_data)->tileDesc).ySize = 0;
        local_10 = Header::dataWindow((Header *)0x8672ad);
        *(int *)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header.
                 _M_header.field_0x4 = (local_10->min).y;
        *(int *)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_parent = (local_10->max).y;
        pvVar5 = operator_new(0x10);
        DeepScanLineInputFile::DeepScanLineInputFile
                  ((DeepScanLineInputFile *)in_stack_fffffffffffffc90,
                   &in_stack_fffffffffffffc88->header,in_stack_fffffffffffffc80,
                   (int)((ulong)in_stack_fffffffffffffc78 >> 0x20),(int)in_stack_fffffffffffffc78);
        *(void **)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl = pvVar5;
        piVar3 = (int *)operator_new(0x10);
        CompositeDeepScanLine::CompositeDeepScanLine(in_stack_fffffffffffffc50);
        ((Data *)in_RDI->_data)->numXTiles = piVar3;
        CompositeDeepScanLine::addSource(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        return;
      }
    }
    bVar1 = isTiled((((Data *)in_RDI->_data)->tileDesc).xSize);
    if ((!bVar1) || (bVar1 = isNonImage((((Data *)in_RDI->_data)->tileDesc).xSize), bVar1)) {
      bVar1 = Header::hasType((Header *)0x867512);
      if (bVar1) {
        Header::type_abi_cxx11_((Header *)0x86752a);
        _Var2 = std::operator==(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        if (!_Var2) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b0);
          poVar6 = std::operator<<(local_1a0,"InputFile cannot handle parts of type ");
          psVar7 = Header::type_abi_cxx11_((Header *)0x8675fc);
          std::operator<<(poVar6,(string *)psVar7);
          pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar8,local_1b0);
          __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
      }
      pvVar5 = operator_new(0x18);
      ScanLineInputFile::ScanLineInputFile
                (in_RDI,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,numThreads);
      *(void **)&(in_RDI->_data->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header =
           pvVar5;
    }
    else {
      *(undefined1 *)&(((Data *)in_RDI->_data)->tileDesc).ySize = 1;
      p_Var4 = Header::lineOrder((Header *)0x867425);
      (((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = *p_Var4;
      local_28 = Header::dataWindow((Header *)0x867446);
      *(int *)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header.
               _M_header.field_0x4 = (local_28->min).y;
      *(int *)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_parent = (local_28->max).y;
      pvVar5 = operator_new(0x10);
      TiledInputFile::TiledInputFile
                ((TiledInputFile *)in_RDI,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                 (int)((ulong)pvVar5 >> 0x20),(int)pvVar5);
      *(void **)&(((Data *)in_RDI->_data)->tileDesc).mode = pvVar5;
    }
  }
  else {
    bVar1 = Header::hasType((Header *)0x867691);
    if (bVar1) {
      Header::type_abi_cxx11_((Header *)0x8676ac);
      _Var2 = std::operator==(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      if (_Var2) {
        *(undefined1 *)&(((Data *)in_RDI->_data)->tileDesc).ySize = 0;
        local_1b8 = Header::dataWindow((Header *)0x8676de);
        *(int *)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header.
                 _M_header.field_0x4 = (local_1b8->min).y;
        *(int *)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_parent = (local_1b8->max).y;
        this_00 = (DeepScanLineInputFile *)operator_new(0x10);
        DeepScanLineInputFile::DeepScanLineInputFile(this_00,in_stack_fffffffffffffc68);
        *(DeepScanLineInputFile **)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl =
             this_00;
        piVar3 = (int *)operator_new(0x10);
        CompositeDeepScanLine::CompositeDeepScanLine(in_stack_fffffffffffffc50);
        ((Data *)in_RDI->_data)->numXTiles = piVar3;
        CompositeDeepScanLine::addSource(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        return;
      }
    }
    bVar1 = Header::hasType((Header *)0x867806);
    if (bVar1) {
      Header::type_abi_cxx11_((Header *)0x867821);
      _Var2 = std::operator==(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      if (_Var2) {
        *(undefined1 *)&(((Data *)in_RDI->_data)->tileDesc).ySize = 1;
        p_Var4 = Header::lineOrder((Header *)0x867853);
        (((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_color = *p_Var4;
        local_1c0 = Header::dataWindow((Header *)0x867874);
        *(int *)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header.
                 _M_header.field_0x4 = (local_1c0->min).y;
        *(int *)&(((Data *)in_RDI->_data)->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_parent = (local_1c0->max).y;
        pvVar5 = operator_new(0x10);
        TiledInputFile::TiledInputFile
                  ((TiledInputFile *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        *(void **)&(((Data *)in_RDI->_data)->tileDesc).mode = pvVar5;
        return;
      }
    }
    bVar1 = Header::hasType((Header *)0x86792b);
    if (bVar1) {
      Header::type_abi_cxx11_((Header *)0x867943);
      _Var2 = std::operator==(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      if (!_Var2) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_348);
        poVar6 = std::operator<<(local_338,"InputFile cannot handle parts of type ");
        psVar7 = Header::type_abi_cxx11_((Header *)0x867a04);
        std::operator<<(poVar6,(string *)psVar7);
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar8,local_348);
        __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    pvVar5 = operator_new(0x18);
    ScanLineInputFile::ScanLineInputFile(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    *(void **)&((Data *)in_RDI->_data)->version = pvVar5;
  }
  return;
}

Assistant:

void
InputFile::initialize ()
{
    if (!_data->part)
    {
        if(_data->header.hasType() && _data->header.type()==DEEPSCANLINE)
        {
            _data->isTiled=false;
            const Box2i &dataWindow = _data->header.dataWindow();
            _data->minY = dataWindow.min.y;
            _data->maxY = dataWindow.max.y;
            
            _data->dsFile = new DeepScanLineInputFile (_data->header,
                                               _data->_streamData->is,
                                               _data->version,
                                               _data->numThreads);
            _data->compositor = new CompositeDeepScanLine;
            _data->compositor->addSource(_data->dsFile);
        }
        
        else if (isTiled (_data->version) && !isNonImage(_data->version)) 
        {
            _data->isTiled = true;
            _data->lineOrder = _data->header.lineOrder();

            //
            // Save the dataWindow information
            //
    
            const Box2i &dataWindow = _data->header.dataWindow();
            _data->minY = dataWindow.min.y;
            _data->maxY = dataWindow.max.y;

            _data->tFile = new TiledInputFile (_data->header,
                                               _data->_streamData->is,
                                               _data->version,
                                               _data->numThreads);
        }
        
        else if(!_data->header.hasType() || _data->header.type()==SCANLINEIMAGE)
        {
            _data->sFile = new ScanLineInputFile (_data->header,
                                                  _data->_streamData->is,
                                                  _data->numThreads);
        }else{
            // type set but not recognised
            
            THROW(IEX_NAMESPACE::ArgExc, "InputFile cannot handle parts of type " << _data->header.type());
        }
    }
    else
    {
        if(_data->header.hasType() && _data->header.type()==DEEPSCANLINE)
        {
            _data->isTiled=false;
            const Box2i &dataWindow = _data->header.dataWindow();
            _data->minY = dataWindow.min.y;
            _data->maxY = dataWindow.max.y;
            
            _data->dsFile = new DeepScanLineInputFile (_data->part);
            _data->compositor = new CompositeDeepScanLine;
            _data->compositor->addSource(_data->dsFile);
        }
        else if (_data->header.hasType() && _data->header.type()==TILEDIMAGE)
        {
            _data->isTiled = true;
            _data->lineOrder = _data->header.lineOrder();

            //
            // Save the dataWindow information
            //

            const Box2i &dataWindow = _data->header.dataWindow();
            _data->minY = dataWindow.min.y;
            _data->maxY = dataWindow.max.y;

            _data->tFile = new TiledInputFile (_data->part);
        }
        else if(!_data->header.hasType() || _data->header.type()==SCANLINEIMAGE)
        {
            _data->sFile = new ScanLineInputFile (_data->part);
        }else{
            THROW(IEX_NAMESPACE::ArgExc, "InputFile cannot handle parts of type " << _data->header.type());
            
        }
    }
}